

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* readModifiers_abi_cxx11_
            (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,XMLNode *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  _Alloc_hider _Var3;
  XMLNode *pXVar4;
  int iVar5;
  undefined4 extraout_var;
  char *__s;
  void *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  bool condition;
  ulong uVar10;
  string value;
  string bitCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arraySizes;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  XMLNode *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((node == (XMLNode *)0x0) ||
     (iVar5 = (*node->_vptr_XMLNode[7])(node), CONCAT44(extraout_var,iVar5) == 0))
  goto LAB_001f83c8;
  __s = tinyxml2::XMLNode::Value(node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,__s,(allocator<char> *)&local_c0);
  trim(&local_a0,&local_e0);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_a0._M_string_length == 0) {
    __assert_fail("!value.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                  ,0x147,
                  "std::pair<std::vector<std::string>, std::string> readModifiers(const tinyxml2::XMLNode *)"
                 );
  }
  bVar2 = *local_a0._M_dataplus._M_p;
  condition = true;
  local_38 = __return_storage_ptr__;
  if (bVar2 < 0x3b) {
    if (bVar2 == 0x29) goto LAB_001f82ef;
    if (bVar2 != 0x3a) goto LAB_001f82ed;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_c0,&local_a0,1,0xffffffffffffffff);
    trim(&local_e0,&local_c0);
    readModifiers_abi_cxx11_();
  }
  else {
    if (bVar2 != 0x3b) {
      if (bVar2 == 0x5b) {
        local_80 = node;
        if (local_a0._M_string_length != 1) {
          uVar10 = 0;
          do {
            _Var3._M_p = local_a0._M_dataplus._M_p;
            uVar9 = 0xffffffffffffffff;
            if (uVar10 <= local_a0._M_string_length && local_a0._M_string_length - uVar10 != 0) {
              pvVar6 = memchr(local_a0._M_dataplus._M_p + uVar10,0x5b,
                              local_a0._M_string_length - uVar10);
              uVar9 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)_Var3._M_p;
            }
            iVar5 = local_80->_parseLineNum;
            std::operator+(&local_c0,"could not find \'[\' in <",&local_a0);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_c0,">");
            local_e0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p == paVar8) {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_e0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_e0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            checkForError(uVar9 != 0xffffffffffffffff,iVar5,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar1) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            _Var3._M_p = local_a0._M_dataplus._M_p;
            uVar10 = 0xffffffffffffffff;
            if (uVar9 <= local_a0._M_string_length && local_a0._M_string_length - uVar9 != 0) {
              pvVar6 = memchr(local_a0._M_dataplus._M_p + uVar9,0x5d,
                              local_a0._M_string_length - uVar9);
              uVar10 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)_Var3._M_p;
            }
            iVar5 = local_80->_parseLineNum;
            std::operator+(&local_c0,"could not find \']\' in <",&local_a0);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_c0,">");
            local_e0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p == paVar8) {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_e0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_e0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            checkForError(uVar10 != 0xffffffffffffffff,iVar5,&local_e0);
            pXVar4 = local_80;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar1) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            iVar5 = pXVar4->_parseLineNum;
            std::operator+(&local_c0,"missing content between \'[\' and \']\' in <",&local_a0);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_c0,">");
            local_e0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p == paVar8) {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_e0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_e0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            checkForError(uVar9 + 2 <= uVar10,iVar5,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar1) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_e0,&local_a0,uVar9 + 1,~uVar9 + uVar10);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar1) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
          } while (uVar10 + 1 != local_a0._M_string_length);
        }
        goto LAB_001f839d;
      }
LAB_001f82ed:
      condition = false;
    }
LAB_001f82ef:
    iVar5 = node->_parseLineNum;
    std::operator+(&local_c0,"unknown modifier <",&local_a0);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_c0,">");
    local_e0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar8) {
      local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_e0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    checkForError(condition,iVar5,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001f839d:
  __return_storage_ptr__ = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    __return_storage_ptr__ = local_38;
  }
LAB_001f83c8:
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::vector<std::string>, std::string> readModifiers( tinyxml2::XMLNode const * node )
{
  std::vector<std::string> arraySizes;
  std::string              bitCount;
  if ( node && node->ToText() )
  {
    // following the name there might be some array size
    std::string value = trim( node->Value() );
    assert( !value.empty() );
    if ( value[0] == '[' )
    {
      std::string::size_type endPos = 0;
      while ( endPos + 1 != value.length() )
      {
        const std::string::size_type startPos = value.find( '[', endPos );
        checkForError( startPos != std::string::npos, node->GetLineNum(), "could not find '[' in <" + value + ">" );
        endPos = value.find( ']', startPos );
        checkForError( endPos != std::string::npos, node->GetLineNum(), "could not find ']' in <" + value + ">" );
        checkForError( startPos + 2 <= endPos, node->GetLineNum(), "missing content between '[' and ']' in <" + value + ">" );
        arraySizes.push_back( value.substr( startPos + 1, endPos - startPos - 1 ) );
      }
    }
    else if ( value[0] == ':' )
    {
      bitCount = trim( value.substr( 1 ) );
    }
    else
    {
      checkForError( ( value[0] == ';' ) || ( value[0] == ')' ), node->GetLineNum(), "unknown modifier <" + value + ">" );
    }
  }
  return { arraySizes, bitCount };
}